

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

GLint __thiscall
deqp::gles3::Functional::ShaderSourceReplaceCase::getSourceLength
          (ShaderSourceReplaceCase *this,Shader *shader)

{
  uint in_EAX;
  GLenum err;
  CallLogWrapper *this_00;
  GLint sourceLength;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetShaderiv
            (this_00,shader->m_shader,0x8b88,(GLint *)((long)&uStack_18 + 4));
  err = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                  ,0x26d);
  return uStack_18._4_4_;
}

Assistant:

GLint getSourceLength (glu::Shader& shader)
	{
		GLint sourceLength = 0;
		glGetShaderiv(shader.getShader(), GL_SHADER_SOURCE_LENGTH, &sourceLength);
		GLU_CHECK();

		return sourceLength;
	}